

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O0

bool __thiscall
FIX::double_conversion::FastDtoa
          (double_conversion *this,double v,FastDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  bool bVar1;
  char *pcVar2;
  undefined4 in_register_00000014;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  int local_48;
  bool local_41;
  int decimal_exponent;
  bool result;
  int *local_38;
  int *decimal_point_local;
  int *length_local;
  int requested_digits_local;
  FastDtoaMode mode_local;
  double v_local;
  Vector<char> buffer_local;
  
  v_local = (double)CONCAT44(in_register_00000014,requested_digits);
  decimal_point_local = buffer._8_8_;
  buffer_local.start_._0_4_ = (uint)buffer.start_;
  length_local._4_4_ = (uint)this;
  local_38 = length;
  length_local._0_4_ = mode;
  _requested_digits_local = v;
  if (v <= 0.0) {
    __assert_fail("v > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x281,
                  "bool FIX::double_conversion::FastDtoa(double, FastDtoaMode, int, Vector<char>, int *, int *)"
                 );
  }
  Double::Double((Double *)&decimal_exponent,v);
  bVar1 = Double::IsSpecial((Double *)&decimal_exponent);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!Double(v).IsSpecial()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0x282,
                  "bool FIX::double_conversion::FastDtoa(double, FastDtoaMode, int, Vector<char>, int *, int *)"
                 );
  }
  local_41 = false;
  local_48 = 0;
  if (length_local._4_4_ < 2) {
    buffer_00._8_8_ = decimal_point_local;
    buffer_00.start_ = (char *)(ulong)(uint)buffer_local.start_;
    local_41 = Grisu3((double_conversion *)(ulong)length_local._4_4_,_requested_digits_local,
                      SUB84(v_local,0),buffer_00,&local_48,length);
  }
  else {
    if (length_local._4_4_ != 2) {
      abort();
    }
    buffer_01._8_8_ = decimal_point_local;
    buffer_01.start_ = (char *)(ulong)(uint)buffer_local.start_;
    local_41 = Grisu3Counted((double_conversion *)(ulong)(FastDtoaMode)length_local,
                             _requested_digits_local,SUB84(v_local,0),buffer_01,&local_48,length);
  }
  if (local_41 != false) {
    *local_38 = *decimal_point_local + local_48;
    pcVar2 = Vector<char>::operator[]((Vector<char> *)&v_local,*decimal_point_local);
    *pcVar2 = '\0';
  }
  return (bool)(local_41 & 1);
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  ASSERT(v > 0);
  ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}